

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

void cft_fasttext_predictions_free(fasttext_predictions_t *predictions)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  if (predictions != (fasttext_predictions_t *)0x0) {
    lVar1 = 8;
    for (uVar2 = 0; uVar2 < predictions->length; uVar2 = uVar2 + 1) {
      free(*(void **)((long)&predictions->predictions->prob + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    free(predictions->predictions);
    free(predictions);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_predictions_free(fasttext_predictions_t* predictions) {
    if (predictions == nullptr) {
        return;
    }
    for (size_t i = 0; i < predictions->length; i++) {
        fasttext_prediction_t pred = predictions->predictions[i];
        free(pred.label);
    }
    free(predictions->predictions);
    free(predictions);
}